

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pri.c
# Opt level: O3

bool_t priIsSieved(word *a,size_t n,size_t base_count,void *stack)

{
  bool_t bVar1;
  size_t n_00;
  bool bVar2;
  
  n_00 = wwWordSize(a,n);
  bVar1 = zzIsEven(a,n_00);
  if (bVar1 == 0) {
    if (base_count != 0 && n_00 == 1) {
      do {
        if (*(ulong *)(&DAT_00160df8 + base_count * 8) <= *a) goto LAB_00150494;
        base_count = base_count - 1;
      } while (base_count != 0);
      base_count = 0;
    }
LAB_00150494:
    priBaseMod((word *)stack,a,n_00,base_count);
    do {
      bVar2 = base_count == 0;
      base_count = base_count - 1;
      if (bVar2) {
        return 1;
      }
    } while (*(long *)((long)stack + base_count * 8) != 0);
  }
  return 0;
}

Assistant:

bool_t priIsSieved(const word a[], size_t n, size_t base_count, void* stack)
{
	// переменные в stack
	word* mods;
	// pre
	ASSERT(base_count <= priBaseSize());
	// четное?
	n = wwWordSize(a, n);
	if (zzIsEven(a, n))
		return FALSE;
	// малое a?
	if (n == 1)
		// при необходимости скорректировать факторную базу
		while (base_count > 0 && priBasePrime(base_count - 1) > a[0])
			--base_count;
	// раскладка stack
	mods = (word*)stack;
	// найти остатки
	priBaseMod(mods, a, n, base_count);
	// есть нулевые остатки?
	while (base_count--)
		if (mods[base_count] == 0)
			return FALSE;
	// нет
	return TRUE;
}